

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_low_entropy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  internal_state_conflict *piVar2;
  uint32_t uVar3;
  uint uVar4;
  
  piVar1 = strm->state;
  uVar3 = bits_ask(strm,1);
  if (uVar3 != 0) {
    piVar2 = strm->state;
    uVar4 = piVar2->bitp - 1;
    piVar1->id = (uint)((piVar2->acc >> ((ulong)uVar4 & 0x3f) & 1) != 0);
    piVar2->bitp = uVar4;
    piVar1->mode = m_low_entropy_ref;
  }
  return (uint)(uVar3 != 0);
}

Assistant:

static int m_low_entropy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (bits_ask(strm, 1) == 0)
        return M_EXIT;
    state->id = bits_get(strm, 1);
    bits_drop(strm, 1);
    state->mode = m_low_entropy_ref;
    return M_CONTINUE;
}